

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O1

CtxItem * __thiscall di::Context::getItem<T2_C>(Context *this)

{
  char *__s1;
  int iVar1;
  iterator iVar2;
  _Base_ptr __k;
  key_type local_20;
  
  local_20._M_target = (type_info *)&T2_C::typeinfo;
  iVar2 = std::
          _Rb_tree<std::type_index,_std::pair<const_std::type_index,_di::Context::CtxItem>,_std::_Select1st<std::pair<const_std::type_index,_di::Context::CtxItem>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
          ::find((_Rb_tree<std::type_index,_std::pair<const_std::type_index,_di::Context::CtxItem>,_std::_Select1st<std::pair<const_std::type_index,_di::Context::CtxItem>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
                  *)this,&local_20);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->items)._M_t._M_impl.super__Rb_tree_header) {
    addFactoryPriv<T2_C,T2_B>(this,T2_C::factory);
    __k = (_Base_ptr)&local_20;
    local_20._M_target = (type_info *)&T2_C::typeinfo;
  }
  else {
    if ((iVar2._M_node[1]._M_parent != (_Base_ptr)0x0) ||
       (iVar2._M_node[2]._M_parent != (_Base_ptr)0x0)) goto LAB_0010f42c;
    __s1 = *(char **)(*(long *)(iVar2._M_node + 3) + 8);
    if (__s1 == __Rb_tree_decrement) goto LAB_0010f42c;
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,__Rb_tree_decrement);
      if (iVar1 == 0) goto LAB_0010f42c;
    }
    __k = iVar2._M_node + 3;
  }
  iVar2 = std::
          _Rb_tree<std::type_index,_std::pair<const_std::type_index,_di::Context::CtxItem>,_std::_Select1st<std::pair<const_std::type_index,_di::Context::CtxItem>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
          ::find((_Rb_tree<std::type_index,_std::pair<const_std::type_index,_di::Context::CtxItem>,_std::_Select1st<std::pair<const_std::type_index,_di::Context::CtxItem>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
                  *)this,__k);
LAB_0010f42c:
  return (CtxItem *)&iVar2._M_node[1]._M_parent;
}

Assistant:

CtxItem& getItem()
    {
        auto it = items.find( std::type_index(typeid(T)) );

        if (it == items.end())
        {
            addClassAuto<T>(nullptr);
            it = items.find( std::type_index(typeid(T)) );
        }
        else
        {
            CtxItem& item = it->second;

            // fallback to derived type (no instance or factory, but a derived type is registered)
            if ( !item.instancePtr && !item.factory && (item.derivedType != std::type_index(typeid(void))) )
                it = items.find(item.derivedType);
        }

        return it->second;
    }